

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O0

void __thiscall
S2Builder::Graph::EdgeProcessor::EdgeProcessor
          (EdgeProcessor *this,GraphOptions *options,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges,
          vector<int,_std::allocator<int>_> *input_ids,IdSetLexicon *id_set_lexicon)

{
  undefined3 uVar1;
  DegenerateEdges DVar2;
  DuplicateEdges DVar3;
  SiblingPairs SVar4;
  size_type sVar5;
  iterator iVar6;
  iterator iVar7;
  allocator<int> local_45 [20];
  allocator<int> local_31;
  IdSetLexicon *local_30;
  IdSetLexicon *id_set_lexicon_local;
  vector<int,_std::allocator<int>_> *input_ids_local;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges_local;
  GraphOptions *options_local;
  EdgeProcessor *this_local;
  
  uVar1 = *(undefined3 *)&options->field_0x11;
  (this->options_).allow_vertex_filtering_ = options->allow_vertex_filtering_;
  *(undefined3 *)&(this->options_).field_0x11 = uVar1;
  DVar2 = options->degenerate_edges_;
  DVar3 = options->duplicate_edges_;
  SVar4 = options->sibling_pairs_;
  (this->options_).edge_type_ = options->edge_type_;
  (this->options_).degenerate_edges_ = DVar2;
  (this->options_).duplicate_edges_ = DVar3;
  (this->options_).sibling_pairs_ = SVar4;
  this->edges_ = edges;
  this->input_ids_ = input_ids;
  this->id_set_lexicon_ = id_set_lexicon;
  local_30 = id_set_lexicon;
  id_set_lexicon_local = (IdSetLexicon *)input_ids;
  input_ids_local = (vector<int,_std::allocator<int>_> *)edges;
  edges_local = (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)options;
  options_local = &this->options_;
  sVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                    (this->edges_);
  std::allocator<int>::allocator(&local_31);
  std::vector<int,_std::allocator<int>_>::vector(&this->out_edges_,sVar5,&local_31);
  std::allocator<int>::~allocator(&local_31);
  sVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                    (this->edges_);
  std::allocator<int>::allocator(local_45);
  std::vector<int,_std::allocator<int>_>::vector(&this->in_edges_,sVar5,local_45);
  std::allocator<int>::~allocator(local_45);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector(&this->new_edges_)
  ;
  std::vector<int,_std::allocator<int>_>::vector(&this->new_input_ids_);
  std::vector<int,_std::allocator<int>_>::vector(&this->tmp_ids_);
  iVar6 = std::vector<int,_std::allocator<int>_>::begin(&this->out_edges_);
  iVar7 = std::vector<int,_std::allocator<int>_>::end(&this->out_edges_);
  std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar6._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar7._M_current,0);
  iVar6 = std::vector<int,_std::allocator<int>_>::begin(&this->out_edges_);
  iVar7 = std::vector<int,_std::allocator<int>_>::end(&this->out_edges_);
  std::
  sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,S2Builder::Graph::EdgeProcessor::EdgeProcessor(S2Builder::GraphOptions_const&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>*,std::vector<int,std::allocator<int>>*,IdSetLexicon*)::__0>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar6._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar7._M_current,
             (anon_class_8_1_8991fb9c)this);
  iVar6 = std::vector<int,_std::allocator<int>_>::begin(&this->in_edges_);
  iVar7 = std::vector<int,_std::allocator<int>_>::end(&this->in_edges_);
  std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar6._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar7._M_current,0);
  iVar6 = std::vector<int,_std::allocator<int>_>::begin(&this->in_edges_);
  iVar7 = std::vector<int,_std::allocator<int>_>::end(&this->in_edges_);
  std::
  sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,S2Builder::Graph::EdgeProcessor::EdgeProcessor(S2Builder::GraphOptions_const&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>*,std::vector<int,std::allocator<int>>*,IdSetLexicon*)::__1>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar6._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar7._M_current,
             (anon_class_8_1_8991fb9c)this);
  sVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                    (this->edges_);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::reserve
            (&this->new_edges_,sVar5);
  sVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                    (this->edges_);
  std::vector<int,_std::allocator<int>_>::reserve(&this->new_input_ids_,sVar5);
  return;
}

Assistant:

Graph::EdgeProcessor::EdgeProcessor(const GraphOptions& options,
                                    vector<Edge>* edges,
                                    vector<InputEdgeIdSetId>* input_ids,
                                    IdSetLexicon* id_set_lexicon)
    : options_(options), edges_(*edges),
      input_ids_(*input_ids), id_set_lexicon_(id_set_lexicon),
      out_edges_(edges_.size()), in_edges_(edges_.size()) {
  // Sort the outgoing and incoming edges in lexigraphic order.  We use a
  // stable sort to ensure that each undirected edge becomes a sibling pair,
  // even if there are multiple identical input edges.
  std::iota(out_edges_.begin(), out_edges_.end(), 0);
  std::sort(out_edges_.begin(), out_edges_.end(), [this](EdgeId a, EdgeId b) {
      return StableLessThan(edges_[a], edges_[b], a, b);
    });
  std::iota(in_edges_.begin(), in_edges_.end(), 0);
  std::sort(in_edges_.begin(), in_edges_.end(), [this](EdgeId a, EdgeId b) {
      return StableLessThan(reverse(edges_[a]), reverse(edges_[b]), a, b);
    });
  new_edges_.reserve(edges_.size());
  new_input_ids_.reserve(edges_.size());
}